

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *prop,string *value)

{
  int iVar1;
  CacheEntryType CVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 == 0) {
    CVar2 = cmState::StringToCacheEntryType(value);
    this->Type = CVar2;
    return;
  }
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 != 0) {
    cmPropertyMap::SetProperty(&this->Properties,prop,(cmValue)value);
    return;
  }
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& prop,
                                             const std::string& value)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType(value);
  } else if (prop == "VALUE") {
    this->Value = value;
  } else {
    this->Properties.SetProperty(prop, value);
  }
}